

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O2

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::
async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::const_buffers_1&>
          (coro_io *this,basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *socket,
          const_buffers_1 *buffer)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    *puVar1 = 
    async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::const_buffers_1&>
    ;
    puVar1[1] = 
    async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::const_buffers_1&>
    ;
    puVar1[0x12] = buffer;
    puVar1[0x11] = socket;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    *(undefined1 *)(puVar1 + 8) = 0;
    *(undefined8 **)this = puVar1;
    *(undefined1 *)(puVar1 + 0x13) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

inline async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_write(
    Socket &socket, AsioBuffer &&buffer) noexcept {
  callback_awaitor<std::pair<std::error_code, size_t>> awaitor;
  co_return co_await awaitor.await_resume([&](auto handler) {
    asio::async_write(socket, buffer, [&, handler](const auto &ec, auto size) {
      handler.set_value_then_resume(ec, size);
    });
  });
}